

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

void Lf_ManPrintQuit(Lf_Man_t *p,Gia_Man_t *pNew)

{
  uint uVar1;
  Vec_Mem_t *pVVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  int iVar7;
  abctime aVar8;
  abctime time;
  char *pStr;
  int i;
  ulong uVar9;
  double dVar10;
  double dVar11;
  float fVar12;
  float fVar13;
  
  dVar10 = Gia_ManMemory(p->pGia);
  iVar7 = p->pGia->nObjs;
  iVar6 = Gia_ManAndNotBufNum(p->pGia);
  pVVar2 = p->vTtMem;
  fVar13 = 0.0;
  fVar12 = 0.0;
  if (pVVar2 != (Vec_Mem_t *)0x0) {
    fVar12 = ((float)pVVar2->nPageAlloc * 8.0 +
              (float)(pVVar2->iPage + 1) *
              (float)(1 << ((byte)pVVar2->LogPageSze & 0x1f)) * (float)pVVar2->nEntrySize * 8.0 +
             48.0) * 9.536743e-07;
  }
  if (pNew->vMapping != (Vec_Int_t *)0x0) {
    fVar13 = ((float)pNew->vMapping->nCap * 4.0 + 16.0) * 9.536743e-07;
  }
  dVar11 = p->CutCount[0];
  if ((dVar11 == 0.0) && (!NAN(dVar11))) {
    p->CutCount[0] = 1.0;
    dVar11 = 1.0;
  }
  if (p->pPars->fVerbose != 0) {
    fVar4 = (float)iVar6 * 32.0 * 9.536743e-07 +
            (float)((p->vStoreOld).vPages.nSize + (p->vFreePages).nSize) *
            (float)((p->vStoreOld).MaskPage + 1) * 9.536743e-07;
    fVar3 = (float)(iVar6 * 3 + iVar7 * 2) * 4.0 * 9.536743e-07;
    fVar5 = (float)(p->vMemSets).nSize * (float)p->nSetWords * 8.0 * 4096.0 * 9.536743e-07;
    printf("CutPair = %.0f  ",dVar11);
    printf("Merge = %.0f (%.2f %%)  ",p->CutCount[1],(p->CutCount[1] * 100.0) / p->CutCount[0]);
    printf("Eval = %.0f (%.2f %%)  ",p->CutCount[2],(p->CutCount[2] * 100.0) / p->CutCount[0]);
    printf("Cut = %.0f (%.2f %%)  ",p->CutCount[3],(p->CutCount[3] * 100.0) / p->CutCount[0]);
    putchar(10);
    printf("Gia = %.2f MB  ",(double)(float)(dVar10 * 9.5367431640625e-07));
    printf("Man = %.2f MB  ",(double)fVar3);
    printf("Best = %.2f MB  ",(double)fVar4);
    printf("Front = %.2f MB   ",(double)fVar5);
    printf("Map = %.2f MB  ",(double)fVar13);
    printf("TT = %.2f MB  ",(double)fVar12);
    printf("Total = %.2f MB",
           (double)((float)(dVar10 * 9.5367431640625e-07) + fVar3 + fVar4 + fVar5 + fVar13 + fVar12)
          );
    putchar(10);
    for (uVar9 = 0; (long)uVar9 <= (long)p->pPars->nLutSize; uVar9 = uVar9 + 1) {
      printf("%d:%d  ",uVar9 & 0xffffffff,(ulong)(uint)p->nCutCounts[uVar9]);
    }
    uVar1 = p->nCutEqual;
    iVar7 = p->Iter;
    iVar6 = Gia_ManAndNotBufNum(p->pGia);
    printf("Equal = %d (%.0f %%) ",(((double)(int)uVar1 * 100.0) / (double)iVar7) / (double)iVar6,
           (ulong)uVar1);
    if (p->vTtMem != (Vec_Mem_t *)0x0) {
      printf("TT = %d (%.2f %%)  ",((double)p->vTtMem->nEntries * 100.0) / p->CutCount[2]);
    }
    if (p->pGia->pMuxes != (uint *)0x0) {
      if (p->nCutMux != 0) {
        printf("MuxTT = %d (%.0f %%) ",
               (((double)p->nCutMux * 100.0) / (double)p->Iter) / (double)p->pGia->nMuxes);
      }
    }
    putchar(10);
    printf("CoDrvs = %d (%.2f %%)  ",((double)p->nCoDrivers * 100.0) / (double)p->pGia->vCos->nSize)
    ;
    printf("CoInvs = %d (%.2f %%)  ",((double)p->nInverters * 100.0) / (double)p->pGia->vCos->nSize)
    ;
    uVar1 = p->nFrontMax;
    iVar7 = Gia_ManAndNum(p->pGia);
    printf("Front = %d (%.2f %%)  ",((double)(int)uVar1 * 100.0) / (double)iVar7,(ulong)uVar1);
    pStr = (char *)(ulong)(uint)p->nTimeFails;
    printf("TimeFails = %d   ");
    aVar8 = Abc_Clock();
    Abc_PrintTime((int)aVar8 - (int)p->clkStart,pStr,time);
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

void Lf_ManPrintQuit( Lf_Man_t * p, Gia_Man_t * pNew )
{
    float MemGia   = Gia_ManMemory(p->pGia) / (1<<20);
    float MemMan   = 1.0 * sizeof(int) * (2 * Gia_ManObjNum(p->pGia) + 3 * Gia_ManAndNotBufNum(p->pGia)) / (1<<20); // offset, required, cutsets, maprefs, flowrefs
    float MemCutsB = 1.0 * (p->vStoreOld.MaskPage + 1) * (Vec_PtrSize(&p->vFreePages) + Vec_PtrSize(&p->vStoreOld.vPages)) / (1<<20) + 1.0 * sizeof(Lf_Bst_t) * Gia_ManAndNotBufNum(p->pGia) / (1<<20);
    float MemCutsF = 1.0 * sizeof(word) * p->nSetWords * (1<<LF_LOG_PAGE) * Vec_PtrSize(&p->vMemSets) / (1<<20);
    float MemTt    = p->vTtMem ? Vec_MemMemory(p->vTtMem) / (1<<20) : 0;
    float MemMap   = Vec_IntMemory(pNew->vMapping) / (1<<20);
    if ( p->CutCount[0] == 0 )
        p->CutCount[0] = 1;
    if ( !p->pPars->fVerbose )
        return;
    printf( "CutPair = %.0f  ",         p->CutCount[0] );
    printf( "Merge = %.0f (%.2f %%)  ", p->CutCount[1], 100.0*p->CutCount[1]/p->CutCount[0] );
    printf( "Eval = %.0f (%.2f %%)  ",  p->CutCount[2], 100.0*p->CutCount[2]/p->CutCount[0] );
    printf( "Cut = %.0f (%.2f %%)  ",   p->CutCount[3], 100.0*p->CutCount[3]/p->CutCount[0] );
    printf( "\n" );
    printf( "Gia = %.2f MB  ",          MemGia );
    printf( "Man = %.2f MB  ",          MemMan ); 
    printf( "Best = %.2f MB  ",         MemCutsB );
    printf( "Front = %.2f MB   ",       MemCutsF );
    printf( "Map = %.2f MB  ",          MemMap ); 
    printf( "TT = %.2f MB  ",           MemTt ); 
    printf( "Total = %.2f MB",          MemGia + MemMan + MemCutsB + MemCutsF + MemMap + MemTt ); 
    printf( "\n" );
    if ( 1 )
    {
        int i;
        for ( i = 0; i <= p->pPars->nLutSize; i++ )
            printf( "%d:%d  ", i, p->nCutCounts[i] );
        printf( "Equal = %d (%.0f %%) ", p->nCutEqual, 100.0 * p->nCutEqual / p->Iter / Gia_ManAndNotBufNum(p->pGia) );
        if ( p->vTtMem )
            printf( "TT = %d (%.2f %%)  ", Vec_MemEntryNum(p->vTtMem), 100.0 * Vec_MemEntryNum(p->vTtMem) / p->CutCount[2] );
        if ( p->pGia->pMuxes && p->nCutMux )
            printf( "MuxTT = %d (%.0f %%) ", p->nCutMux, 100.0 * p->nCutMux / p->Iter / Gia_ManMuxNum(p->pGia) );
        printf( "\n" );
    }
    printf( "CoDrvs = %d (%.2f %%)  ",  p->nCoDrivers, 100.0*p->nCoDrivers/Gia_ManCoNum(p->pGia) );
    printf( "CoInvs = %d (%.2f %%)  ",  p->nInverters, 100.0*p->nInverters/Gia_ManCoNum(p->pGia) );
    printf( "Front = %d (%.2f %%)  ",   p->nFrontMax,  100.0*p->nFrontMax/Gia_ManAndNum(p->pGia) );
    printf( "TimeFails = %d   ",        p->nTimeFails );
    Abc_PrintTime( 1, "Time",    Abc_Clock() - p->clkStart );
    fflush( stdout );
}